

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetRootInfo(void *cvode_mem,int *rootsfound)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (cvode_mem == (void *)0x0) {
    iVar3 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x5e3,"CVodeGetRootInfo",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    iVar3 = 0;
    uVar1 = (ulong)*(uint *)((long)cvode_mem + 0x568);
    if ((int)*(uint *)((long)cvode_mem + 0x568) < 1) {
      uVar1 = 0;
    }
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      rootsfound[uVar2] = *(int *)(*(long *)((long)cvode_mem + 0x570) + uVar2 * 4);
    }
  }
  return iVar3;
}

Assistant:

int CVodeGetRootInfo(void* cvode_mem, int* rootsfound)
{
  CVodeMem cv_mem;
  int i, nrt;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  nrt = cv_mem->cv_nrtfn;

  for (i = 0; i < nrt; i++) { rootsfound[i] = cv_mem->cv_iroots[i]; }

  return (CV_SUCCESS);
}